

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O1

int __thiscall
cppcms::rpc::json_rpc_server::bind(json_rpc_server *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  mapped_type *this_00;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  method_data data;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  role_type local_28;
  
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  operator=((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)&local_48,
            (function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)__addr);
  local_28 = __len;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
            ::operator[](&this->methods_,(key_type *)CONCAT44(in_register_00000034,__fd));
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  operator=(&this_00->method,
            (function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)&local_48);
  this_00->role = local_28;
  if (local_38 != (code *)0x0) {
    bVar1 = (*local_38)(&local_48,&local_48,__destroy_functor);
    local_38 = (code *)CONCAT71(extraout_var,bVar1);
  }
  return (int)local_38;
}

Assistant:

void json_rpc_server::bind(std::string const &name,method_type const &method,role_type role)
	{
		method_data data;
		data.method=method;
		data.role=role;
		methods_[name]=data;
	}